

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::IfExpr::~IfExpr(IfExpr *this)

{
  IfExpr *this_local;
  
  ~IfExpr(this);
  operator_delete(this);
  return;
}

Assistant:

explicit IfExpr(const Location& loc = Location())
      : ExprMixin<ExprType::If>(loc) {}